

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::GlobalType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
          *values,GlobalType *out,char *desc)

{
  pointer pGVar1;
  Result RVar2;
  Enum EVar3;
  bool bVar4;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar2 = CheckIndex(this,&local_78,
                     (Index)((ulong)((long)(values->
                                           super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(values->
                                          super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3),desc);
  Var::~Var(&local_78);
  if (out != (GlobalType *)0x0) {
    if (RVar2.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      pGVar1 = (values->
               super__Vector_base<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      EVar3 = pGVar1[(var->field_2).index_].type.enum_;
      bVar4 = pGVar1[(var->field_2).index_].mutable_;
    }
    else {
      EVar3 = Any;
      bVar4 = true;
    }
    (out->type).enum_ = EVar3;
    out->mutable_ = bVar4;
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}